

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O1

FT_Error pfr_glyph_load_rec(PFR_Glyph glyph,FT_Stream stream,FT_ULong gps_offset,FT_ULong offset,
                           FT_ULong size)

{
  ushort *puVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  bool bVar7;
  FT_Fixed FVar8;
  FT_Pos FVar9;
  FT_Error FVar10;
  undefined4 uVar11;
  FT_Vector *pFVar12;
  FT_Pos *pFVar13;
  ushort *puVar14;
  PFR_SubGlyphRec *pPVar15;
  int iVar16;
  PFR_Glyph pPVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  FT_GlyphLoader pFVar22;
  uint uVar23;
  byte bVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ushort *puVar28;
  uint uVar29;
  FT_Error error;
  uint local_9c;
  ulong local_98;
  FT_GlyphLoader local_90;
  ushort *local_88;
  ulong local_80;
  FT_Vector local_78;
  FT_Vector local_68;
  FT_Vector local_58;
  ulong local_48;
  ulong uStack_40;
  
  FVar10 = FT_Stream_Seek(stream,offset + gps_offset);
  if (FVar10 != 0) {
    return FVar10;
  }
  FVar10 = FT_Stream_EnterFrame(stream,size);
  FVar9 = local_78.x;
  if (FVar10 != 0) {
    return FVar10;
  }
  pbVar6 = stream->cursor;
  puVar2 = (ushort *)(pbVar6 + size);
  if ((size != 0) && ((char)*pbVar6 < '\0')) {
    local_90 = glyph->loader;
    local_98 = (ulong)glyph->num_subs;
    local_78.x = local_78.x & 0xffffffff00000000;
    if (((long)size < 1) || (bVar3 = *pbVar6, -1 < (char)bVar3)) {
LAB_0014b2bd:
      local_78.x = CONCAT44(local_78.x._4_4_,8);
    }
    else {
      local_88 = (ushort *)(pbVar6 + 1);
      if ((bVar3 & 0x40) != 0) {
        uVar11 = 8;
        if (size == 1) {
LAB_0014b5ca:
          bVar7 = false;
        }
        else {
          puVar28 = (ushort *)(pbVar6 + 2);
          uVar26 = (uint)(byte)*local_88;
          bVar7 = true;
          if ((byte)*local_88 != 0) {
            do {
              puVar14 = puVar28 + 1;
              local_88 = puVar28;
              if ((puVar2 < puVar14) ||
                 (puVar28 = (ushort *)((ulong)(byte)*puVar28 + (long)puVar14), local_88 = puVar14,
                 puVar2 < puVar28)) goto LAB_0014b5ca;
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
          }
          uVar11 = 0;
          local_88 = puVar28;
        }
        local_78.x._4_4_ = SUB84(FVar9,4);
        local_78.x = CONCAT44(local_78.x._4_4_,uVar11);
        if (!bVar7) goto LAB_0014b2c5;
      }
      uVar26 = glyph->num_subs + (bVar3 & 0x3f);
      if (glyph->max_subs < uVar26) {
        uVar26 = uVar26 + 3 & 0xfffffffc;
        if (uVar26 < 0x41) {
          pPVar15 = (PFR_SubGlyphRec *)
                    ft_mem_realloc(local_90->memory,0x20,(ulong)glyph->max_subs,(ulong)uVar26,
                                   glyph->subs,(FT_Error *)&local_78);
          glyph->subs = pPVar15;
          iVar21 = 6;
          if ((uint)local_78.x == 0) {
            glyph->max_subs = uVar26;
            iVar21 = 0;
          }
        }
        else {
          local_78.x = CONCAT44(local_78.x._4_4_,8);
          iVar21 = 6;
        }
        if (iVar21 == 6) goto LAB_0014b2c5;
        pFVar22 = local_90;
        if (iVar21 != 0) goto LAB_0014b2c9;
      }
      if ((bVar3 & 0x3f) != 0) {
        pPVar15 = glyph->subs;
        lVar19 = 0;
        do {
          puVar28 = (ushort *)((long)local_88 + 1);
          if (puVar2 < puVar28) goto LAB_0014bb27;
          bVar4 = (byte)*local_88;
          *(undefined8 *)((long)&pPVar15[local_98].x_scale + lVar19) = 0x10000;
          if ((bVar4 & 0x10) == 0) {
LAB_0014bb81:
            *(undefined8 *)((long)&pPVar15[local_98].y_scale + lVar19) = 0x10000;
            if ((bVar4 & 0x20) != 0) {
              if (puVar28 + 1 <= puVar2) {
                *(ulong *)((long)&pPVar15[local_98].y_scale + lVar19) =
                     ((long)(short)((ushort)(byte)*puVar28 << 8) |
                     (ulong)*(byte *)((long)puVar28 + 1)) << 4;
                puVar28 = puVar28 + 1;
                goto LAB_0014bbbe;
              }
              goto LAB_0014bb9d;
            }
LAB_0014bbbe:
            local_88 = puVar28;
            if ((bVar4 & 3) == 2) {
              if ((ushort *)((long)puVar28 + 1U) <= puVar2) {
                uVar26 = (uint)(char)(byte)*puVar28;
                puVar28 = (ushort *)((long)puVar28 + 1U);
                goto LAB_0014bc06;
              }
            }
            else {
              uVar26 = 0;
              if ((bVar4 & 3) == 1) {
                if (puVar2 < puVar28 + 1) goto LAB_0014bb27;
                uVar26 = (int)(short)((ushort)(byte)*puVar28 << 8) |
                         (uint)*(byte *)((long)puVar28 + 1);
                puVar28 = puVar28 + 1;
              }
LAB_0014bc06:
              bVar24 = bVar4 >> 2 & 3;
              if (bVar24 == 2) {
                if (puVar2 < (ushort *)((long)puVar28 + 1U)) {
                  bVar7 = false;
                  goto LAB_0014bb29;
                }
                uVar29 = (uint)(char)(byte)*puVar28;
                local_88 = (ushort *)((long)puVar28 + 1U);
              }
              else {
                uVar29 = 0;
                local_88 = puVar28;
                if (bVar24 == 1) {
                  if (puVar2 < puVar28 + 1) goto LAB_0014bb5e;
                  uVar29 = (int)(short)((ushort)(byte)*puVar28 << 8) |
                           (uint)*(byte *)((long)puVar28 + 1);
                  local_88 = puVar28 + 1;
                }
              }
              *(uint *)((long)&pPVar15[local_98].x_delta + lVar19) = uVar26;
              *(uint *)((long)&pPVar15[local_98].y_delta + lVar19) = uVar29;
              if ((bVar4 & 0x40) == 0) {
                puVar28 = (ushort *)((long)local_88 + 1);
                if (puVar28 <= puVar2) {
                  uVar26 = (uint)(byte)*local_88;
LAB_0014bca0:
                  *(uint *)((long)&pPVar15[local_98].gps_size + lVar19) = uVar26;
                  if ((char)bVar4 < '\0') {
                    puVar14 = (ushort *)((long)puVar28 + 3);
                    if (puVar2 < puVar14) goto LAB_0014bb9d;
                    uVar26 = (uint)*(byte *)((long)puVar28 + 1) << 8 | (uint)(byte)*puVar28 << 0x10;
                    lVar25 = 2;
                  }
                  else {
                    puVar14 = puVar28 + 1;
                    if (puVar2 < puVar14) {
LAB_0014bb9d:
                      bVar7 = false;
                      goto LAB_0014bb29;
                    }
                    uVar26 = (uint)(byte)*puVar28 << 8;
                    lVar25 = 1;
                  }
                  *(uint *)((long)&pPVar15[local_98].gps_offset + lVar19) =
                       *(byte *)((long)puVar28 + lVar25) | uVar26;
                  glyph->num_subs = glyph->num_subs + 1;
                  bVar7 = true;
                  puVar28 = puVar14;
                  goto LAB_0014bb29;
                }
              }
              else {
                puVar28 = local_88 + 1;
                if (puVar28 <= puVar2) {
                  uVar26 = (uint)(ushort)(*local_88 << 8 | *local_88 >> 8);
                  goto LAB_0014bca0;
                }
              }
            }
LAB_0014bb27:
            bVar7 = false;
            puVar28 = local_88;
          }
          else {
            if ((ushort *)((long)local_88 + 3U) <= puVar2) {
              *(ulong *)((long)&pPVar15[local_98].x_scale + lVar19) =
                   ((long)(short)((ushort)*(byte *)((long)local_88 + 1) << 8) |
                   (ulong)(byte)local_88[1]) << 4;
              puVar28 = (ushort *)((long)local_88 + 3U);
              goto LAB_0014bb81;
            }
LAB_0014bb5e:
            bVar7 = false;
          }
LAB_0014bb29:
          if (!bVar7) goto LAB_0014b2bd;
          lVar19 = lVar19 + 0x20;
          local_88 = puVar28;
        } while ((bVar3 & 0x3f) << 5 != (int)lVar19);
      }
    }
LAB_0014b2c5:
    pFVar22 = local_90;
    uVar26 = (uint)local_78.x;
LAB_0014b2c9:
    local_90 = (FT_GlyphLoader)stream;
    local_88 = (ushort *)gps_offset;
    FT_Stream_ExitFrame(stream);
    uVar18 = local_98;
    if (uVar26 == 0) {
      uVar26 = 0;
      if (glyph->num_subs != (FT_UInt)local_98) {
        local_80 = (ulong)(glyph->num_subs - (FT_UInt)local_98);
        uVar27 = 0;
        do {
          iVar21 = (int)(pFVar22->base).outline.n_points;
          local_98 = uVar27;
          FVar10 = pfr_glyph_load_rec(glyph,(FT_Stream)local_90,(FT_ULong)local_88,
                                      (ulong)glyph->subs[uVar18 + uVar27].gps_offset,
                                      (ulong)glyph->subs[uVar18 + uVar27].gps_size);
          if (FVar10 != 0) {
            return FVar10;
          }
          pPVar15 = glyph->subs;
          iVar16 = (pFVar22->base).outline.n_points - iVar21;
          lVar19 = pPVar15[uVar18 + uVar27].x_scale;
          if ((lVar19 == 0x10000) && (pPVar15[uVar18 + uVar27].y_scale == 0x10000)) {
            if (0 < iVar16) {
              pFVar12 = (pFVar22->base).outline.points + iVar21;
              iVar21 = pPVar15[uVar18 + uVar27].x_delta;
              iVar5 = pPVar15[uVar18 + uVar27].y_delta;
              do {
                pFVar12->x = pFVar12->x + (long)iVar21;
                pFVar12->y = pFVar12->y + (long)iVar5;
                pFVar12 = pFVar12 + 1;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
          }
          else if (0 < iVar16) {
            pFVar12 = (pFVar22->base).outline.points + iVar21;
            iVar21 = pPVar15[uVar18 + uVar27].x_delta;
            FVar8 = pPVar15[uVar18 + uVar27].y_scale;
            iVar5 = pPVar15[uVar18 + uVar27].y_delta;
            do {
              lVar25 = (long)(int)pFVar12->x * (long)(int)lVar19;
              pFVar12->x = (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) +
                           (long)iVar21;
              lVar25 = (long)(int)pFVar12->y * (long)(int)FVar8;
              pFVar12->y = (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) +
                           (long)iVar5;
              pFVar12 = pFVar12 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar27 = local_98 + 1;
          uVar26 = 0;
        } while (uVar27 != local_80);
      }
    }
    return uVar26;
  }
  local_9c = 0;
  if (0 < (long)size) {
    bVar3 = *pbVar6;
    uVar18 = (ulong)bVar3;
    if (-1 < (char)bVar3) {
      if ((bVar3 & 4) == 0) {
        pPVar17 = (PFR_Glyph)0x0;
        if ((bVar3 & 2) == 0) {
          puVar28 = (ushort *)(pbVar6 + 1);
          uVar27 = 0;
        }
        else {
          if (size == 1) goto LAB_0014ba05;
          uVar27 = (ulong)pbVar6[1];
          puVar28 = (ushort *)(pbVar6 + 2);
        }
        if ((bVar3 & 1) != 0) {
          if (puVar2 < (ushort *)((long)puVar28 + 1U)) goto LAB_0014ba05;
          pPVar17 = (PFR_Glyph)(ulong)(byte)*puVar28;
          puVar28 = (ushort *)((long)puVar28 + 1U);
        }
      }
      else {
        if (size == 1) goto LAB_0014ba05;
        puVar28 = (ushort *)(pbVar6 + 2);
        uVar27 = (ulong)(pbVar6[1] & 0xf);
        pPVar17 = (PFR_Glyph)(ulong)(pbVar6[1] >> 4);
      }
      uVar26 = (int)uVar27 + (int)pPVar17;
      local_98 = uVar27;
      local_90 = (FT_GlyphLoader)pPVar17;
      if (glyph->max_xy_control < uVar26) {
        local_88 = (ushort *)CONCAT44(local_88._4_4_,(uint)bVar3);
        uVar29 = uVar26 + 7 & 0xfffffff8;
        pFVar13 = (FT_Pos *)
                  ft_mem_realloc(glyph->loader->memory,8,(ulong)glyph->max_xy_control,(ulong)uVar29,
                                 glyph->x_control,(FT_Error *)&local_9c);
        glyph->x_control = pFVar13;
        iVar21 = 0xc;
        if (local_9c == 0) {
          glyph->max_xy_control = uVar29;
          iVar21 = 0;
        }
        uVar18 = (ulong)local_88 & 0xffffffff;
        if (iVar21 == 0xc) goto LAB_0014ba0d;
        pFVar22 = (FT_GlyphLoader)glyph;
        if (iVar21 != 0) goto LAB_0014ba11;
      }
      pFVar13 = glyph->x_control;
      glyph->y_control = pFVar13 + (local_98 & 0xffffffff);
      if (uVar26 != 0) {
        uVar20 = 0;
        uVar29 = 0;
        uVar27 = 0;
        puVar14 = puVar28;
        do {
          if ((uVar20 & 7) == 0) {
            if (puVar2 < (ushort *)((long)puVar14 + 1U)) goto LAB_0014ba05;
            uVar27 = (ulong)(byte)*puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1U);
          }
          if ((uVar27 & 1) == 0) {
            puVar28 = (ushort *)((long)puVar14 + 1);
            if (puVar2 < puVar28) goto LAB_0014ba05;
            uVar29 = uVar29 + (byte)*puVar14;
          }
          else {
            puVar28 = puVar14 + 1;
            if (puVar2 < puVar28) goto LAB_0014ba05;
            uVar29 = (int)(short)((ushort)(byte)*puVar14 << 8) | (uint)*(byte *)((long)puVar14 + 1);
          }
          pFVar13[uVar20] = (long)(int)uVar29;
          uVar27 = uVar27 >> 1;
          uVar20 = uVar20 + 1;
          puVar14 = puVar28;
        } while (uVar26 != uVar20);
      }
      puVar14 = puVar28;
      if ((uVar18 & 8) == 0) {
LAB_0014b608:
        glyph->path_begun = '\0';
        local_78.x = 0;
        local_78.y = 0;
        local_48 = 0;
        uStack_40 = 0;
        pFVar22 = local_90;
LAB_0014b62b:
        puVar28 = (ushort *)((long)puVar14 + 1);
        uVar26 = 4;
        if (puVar2 < puVar28) goto LAB_0014b9f0;
        uVar29 = (byte)*puVar14 & 0xf;
        uVar18 = (ulong)uVar29;
        bVar3 = (byte)*puVar14 >> 4;
        puVar14 = puVar28;
        switch(bVar3) {
        case 0:
          bVar7 = false;
          uVar18 = (ulong)bVar3;
          uVar29 = (uint)bVar3;
          break;
        case 1:
        case 4:
        case 5:
          bVar7 = true;
          uVar29 = 1;
          break;
        case 2:
          uVar26 = 5;
          if (uVar29 < (uint)local_98) {
            local_78.x = glyph->x_control[uVar18];
LAB_0014b6dd:
            local_78.y = uStack_40;
            local_48 = local_78.x;
            uVar18 = 0;
            bVar7 = false;
            uVar29 = 0;
            break;
          }
          goto LAB_0014b9f0;
        case 3:
          uVar26 = 5;
          if (uVar29 < (uint)pFVar22) {
            local_78.x = local_48;
            uStack_40 = glyph->y_control[uVar29];
            goto LAB_0014b6dd;
          }
LAB_0014b9f0:
          if (uVar26 != 0) goto code_r0x0014b9fc;
          goto LAB_0014b62b;
        case 6:
          bVar7 = true;
          uVar18 = 0xb8e;
          uVar29 = 3;
          break;
        case 7:
          bVar7 = true;
          uVar18 = 0xe2b;
          uVar29 = 3;
          break;
        default:
          bVar7 = true;
          uVar29 = 4;
        }
        if (bVar7) {
          uVar23 = 0;
          pFVar12 = &local_78;
          switch((uint)uVar18 & 3) {
          case 1:
            goto switchD_0014b73f_caseD_1;
          case 2:
            goto switchD_0014b73f_caseD_2;
          case 3:
            goto switchD_0014b73f_caseD_3;
          }
switchD_0014b73f_caseD_0:
          puVar28 = (ushort *)((long)puVar14 + 1);
          uVar26 = 4;
          bVar7 = false;
          if (puVar2 < puVar28) goto LAB_0014b78e;
          uVar26 = 5;
          if ((uint)local_98 <= (uint)(byte)*puVar14) goto LAB_0014b8bd;
          pFVar12->x = glyph->x_control[(byte)*puVar14];
          switch((uint)(uVar18 >> 2) & 3) {
          case 1:
            goto switchD_0014b814_caseD_1;
          case 2:
            goto switchD_0014b814_caseD_2;
          case 3:
            goto switchD_0014b814_caseD_3;
          }
switchD_0014b814_caseD_0:
          puVar14 = (ushort *)((long)puVar28 + 1);
          uVar26 = 4;
          if (puVar2 < puVar14) goto LAB_0014b8bd;
          uVar26 = 5;
          bVar7 = false;
          if ((uint)pFVar22 <= (uint)(byte)*puVar28) goto LAB_0014b78e;
          uVar27 = glyph->y_control[(byte)*puVar28];
LAB_0014b8d9:
          do {
            pFVar12->y = uVar27;
            if ((uVar23 == 0) && (uVar29 == 4)) {
              if ((ushort *)((long)puVar14 + 1U) <= puVar2) {
                uVar18 = (ulong)(byte)*puVar14;
                uVar29 = 3;
                puVar14 = (ushort *)((long)puVar14 + 1U);
                goto LAB_0014b913;
              }
              uVar26 = 4;
              bVar7 = false;
              uVar29 = 4;
            }
            else {
              uVar18 = uVar18 >> 4;
LAB_0014b913:
              local_48 = pFVar12->x;
              uStack_40 = pFVar12->y;
              pFVar12 = pFVar12 + 1;
              uVar26 = 0;
              bVar7 = true;
            }
LAB_0014b78e:
            do {
              if (!bVar7) goto LAB_0014b9f0;
              uVar23 = uVar23 + 1;
              if (uVar29 <= uVar23) goto LAB_0014b92e;
              puVar28 = puVar14;
              switch((uint)uVar18 & 3) {
              case 0:
                goto switchD_0014b73f_caseD_0;
              case 2:
                goto switchD_0014b73f_caseD_2;
              case 3:
switchD_0014b73f_caseD_3:
                pFVar12->x = local_48;
                switch((uint)(uVar18 >> 2) & 3) {
                case 0:
                  goto switchD_0014b814_caseD_0;
                case 1:
                  goto switchD_0014b814_caseD_1;
                case 2:
                  goto switchD_0014b814_caseD_2;
                }
                goto switchD_0014b814_caseD_3;
              }
switchD_0014b73f_caseD_1:
              puVar28 = puVar14 + 1;
              uVar26 = 4;
              bVar7 = false;
            } while (puVar2 < puVar28);
            pFVar12->x = (long)(short)((ushort)(byte)*puVar14 << 8) |
                         (ulong)*(byte *)((long)puVar14 + 1);
            switch((uint)(uVar18 >> 2) & 3) {
            case 0:
              goto switchD_0014b814_caseD_0;
            case 1:
              goto switchD_0014b814_caseD_1;
            case 2:
              goto switchD_0014b814_caseD_2;
            case 3:
switchD_0014b814_caseD_3:
              uVar27 = uStack_40;
              puVar14 = puVar28;
            }
          } while( true );
        }
LAB_0014b92e:
        if (bVar3 - 1 < 3) {
LAB_0014b992:
          uVar26 = pfr_glyph_line_to(glyph,&local_78);
LAB_0014b9db:
          local_9c = uVar26;
          if (uVar26 != 0) {
            uVar26 = 0xc;
          }
        }
        else {
          if (bVar3 - 4 < 2) {
            pFVar22 = glyph->loader;
            pfr_glyph_close_contour(glyph);
            glyph->path_begun = '\x01';
            if ((pFVar22->max_points <
                 (int)(pFVar22->base).outline.n_points + (int)(pFVar22->current).outline.n_points +
                 1U) || (uVar26 = 0,
                        pFVar22->max_contours <
                        (int)(pFVar22->current).outline.n_contours +
                        (int)(pFVar22->base).outline.n_contours + 1U)) {
              uVar26 = FT_GlyphLoader_CheckPoints(pFVar22,1,1);
            }
            pFVar22 = local_90;
            if (uVar26 == 0) goto LAB_0014b992;
            goto LAB_0014b9db;
          }
          if (bVar3 != 0) {
            uVar26 = pfr_glyph_curve_to(glyph,&local_78,&local_68,&local_58);
            goto LAB_0014b9db;
          }
          pfr_glyph_close_contour(glyph);
          FT_GlyphLoader_Add(glyph->loader);
          uVar26 = 0xc;
        }
        goto LAB_0014b9f0;
      }
      puVar14 = (ushort *)((long)puVar28 + 1);
      local_9c = 8;
      if (puVar2 < puVar14) {
LAB_0014b5a3:
        bVar7 = false;
        puVar14 = puVar28;
      }
      else {
        uVar26 = (uint)(byte)*puVar28;
        bVar7 = true;
        if ((byte)*puVar28 != 0) {
          do {
            puVar1 = puVar14 + 1;
            puVar28 = puVar14;
            if ((puVar2 < puVar1) ||
               (puVar14 = (ushort *)((ulong)(byte)*puVar14 + (long)puVar1), puVar28 = puVar1,
               puVar2 < puVar14)) goto LAB_0014b5a3;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
        }
        local_9c = 0;
      }
      if (bVar7) goto LAB_0014b608;
      goto LAB_0014ba0d;
    }
  }
LAB_0014ba05:
  local_9c = 8;
LAB_0014ba0d:
  pFVar22 = (FT_GlyphLoader)(ulong)local_9c;
LAB_0014ba11:
  FT_Stream_ExitFrame(stream);
  return (FT_Error)pFVar22;
switchD_0014b73f_caseD_2:
  puVar28 = (ushort *)((long)puVar14 + 1);
  uVar26 = 4;
  bVar7 = false;
  if (puVar28 <= puVar2) {
    pFVar12->x = (long)(char)(byte)*puVar14 + local_48;
    switch((uint)(uVar18 >> 2) & 3) {
    case 0:
      goto switchD_0014b814_caseD_0;
    case 1:
switchD_0014b814_caseD_1:
      puVar14 = puVar28 + 1;
      uVar26 = 4;
      if (puVar14 <= puVar2) {
        uVar27 = (long)(short)((ushort)(byte)*puVar28 << 8) | (ulong)*(byte *)((long)puVar28 + 1);
        goto LAB_0014b8d9;
      }
      break;
    case 2:
switchD_0014b814_caseD_2:
      puVar14 = (ushort *)((long)puVar28 + 1);
      uVar26 = 4;
      if (puVar14 <= puVar2) goto code_r0x0014b896;
      break;
    case 3:
      goto switchD_0014b814_caseD_3;
    }
LAB_0014b8bd:
    bVar7 = false;
    puVar14 = puVar28;
  }
  goto LAB_0014b78e;
code_r0x0014b896:
  uVar27 = (long)(char)(byte)*puVar28 + uStack_40;
  goto LAB_0014b8d9;
code_r0x0014b9fc:
  if (uVar26 - 4 < 2) goto LAB_0014ba05;
  if (uVar26 != 0xc) goto LAB_0014ba11;
  goto LAB_0014ba0d;
}

Assistant:

static FT_Error
  pfr_glyph_load_rec( PFR_Glyph  glyph,
                      FT_Stream  stream,
                      FT_ULong   gps_offset,
                      FT_ULong   offset,
                      FT_ULong   size )
  {
    FT_Error  error;
    FT_Byte*  p;
    FT_Byte*  limit;


    if ( FT_STREAM_SEEK( gps_offset + offset ) ||
         FT_FRAME_ENTER( size )                )
      goto Exit;

    p     = (FT_Byte*)stream->cursor;
    limit = p + size;

    if ( size > 0 && *p & PFR_GLYPH_IS_COMPOUND )
    {
      FT_UInt         n, old_count, count;
      FT_GlyphLoader  loader = glyph->loader;
      FT_Outline*     base   = &loader->base.outline;


      old_count = glyph->num_subs;

      /* this is a compound glyph - load it */
      error = pfr_glyph_load_compound( glyph, p, limit );

      FT_FRAME_EXIT();

      if ( error )
        goto Exit;

      count = glyph->num_subs - old_count;

      FT_TRACE4(( "compound glyph with %d element%s (offset %lu):\n",
                  count,
                  count == 1 ? "" : "s",
                  offset ));

      /* now, load each individual glyph */
      for ( n = 0; n < count; n++ )
      {
        FT_Int        i, old_points, num_points;
        PFR_SubGlyph  subglyph;


        FT_TRACE4(( "  subglyph %d:\n", n ));

        subglyph   = glyph->subs + old_count + n;
        old_points = base->n_points;

        error = pfr_glyph_load_rec( glyph, stream, gps_offset,
                                    subglyph->gps_offset,
                                    subglyph->gps_size );
        if ( error )
          break;

        /* note that `glyph->subs' might have been re-allocated */
        subglyph   = glyph->subs + old_count + n;
        num_points = base->n_points - old_points;

        /* translate and eventually scale the new glyph points */
        if ( subglyph->x_scale != 0x10000L || subglyph->y_scale != 0x10000L )
        {
          FT_Vector*  vec = base->points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x = FT_MulFix( vec->x, subglyph->x_scale ) +
                       subglyph->x_delta;
            vec->y = FT_MulFix( vec->y, subglyph->y_scale ) +
                       subglyph->y_delta;
          }
        }
        else
        {
          FT_Vector*  vec = loader->base.outline.points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x += subglyph->x_delta;
            vec->y += subglyph->y_delta;
          }
        }

        /* proceed to next sub-glyph */
      }

      FT_TRACE4(( "end compound glyph with %d element%s\n",
                  count,
                  count == 1 ? "" : "s" ));
    }
    else
    {
      FT_TRACE4(( "simple glyph (offset %lu)\n", offset ));

      /* load a simple glyph */
      error = pfr_glyph_load_simple( glyph, p, limit );

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }